

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::GetStructFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Value *type;
  Parser *pPVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  undefined8 uVar9;
  string return_type;
  ImportMapEntry import_entry;
  string local_160;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_80;
  string local_78;
  Type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = (_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)imports;
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_140,&this->namer_,field);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
  paVar3 = &local_e0.first.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_e0.first.field_2._M_allocated_capacity = *psVar7;
    local_e0.first.field_2._8_8_ = plVar5[3];
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first.field_2._M_allocated_capacity = *psVar7;
    local_e0.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e0.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  paVar3 = &local_140.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  type = &field->value;
  GenPackageReference_abi_cxx11_(&local_140.first,this,&type->type);
  local_58 = &type->type;
  GenTypeGet_abi_cxx11_(&local_160,this,&type->type);
  local_e0.first.field_2._M_allocated_capacity = local_140.first.field_2._M_allocated_capacity;
  local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p == paVar3) {
    local_e0.first.field_2._8_8_ = local_140.first.field_2._8_8_;
  }
  else {
    local_e0.first._M_dataplus._M_p = local_140.first._M_dataplus._M_p;
  }
  local_e0.second._M_dataplus._M_p = (pointer)&local_e0.second.field_2;
  local_140.first.field_2._M_allocated_capacity =
       local_140.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == &local_160.field_2) {
    local_e0.second.field_2._8_8_ = local_160.field_2._8_8_;
  }
  else {
    local_e0.second._M_dataplus._M_p = local_160._M_dataplus._M_p;
  }
  local_e0.second.field_2._M_allocated_capacity = local_160.field_2._M_allocated_capacity;
  local_140.first._M_string_length = 0;
  local_140.first._M_dataplus._M_p = (pointer)paVar3;
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    ReturnType_abi_cxx11_(&local_160,this,struct_def,field);
    std::operator+(&local_100," -> Optional[",&local_160);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_140.first.field_2._M_allocated_capacity = *puVar8;
      local_140.first.field_2._8_8_ = plVar5[3];
      local_140.first._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_140.first.field_2._M_allocated_capacity = *puVar8;
      local_140.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140.first._M_string_length = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_140.first._M_dataplus._M_p,
                      local_140.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[9],_true>
              (&local_140,(char (*) [7])0x387b93,(char (*) [9])"Optional");
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_80,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.second._M_dataplus._M_p != &local_140.second.field_2) {
      operator_delete(local_140.second._M_dataplus._M_p,
                      local_140.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_140.first._M_dataplus._M_p,
                      local_140.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              (local_80,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  OffsetPrefix_abi_cxx11_(&local_140.first,this,field,true);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if (((field->value).type.struct_def)->fixed == true) {
    std::operator+(&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(anonymous_namespace)::Indent_abi_cxx11_);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first.field_2._8_8_ = plVar5[3];
      local_140.first._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_140.first._M_dataplus._M_p,
                      local_140.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_160,(anonymous_namespace)::Indent_abi_cxx11_);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first.field_2._8_8_ = plVar5[3];
      local_140.first._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_140.first._M_dataplus._M_p,
                      local_140.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
  }
  pPVar4 = (this->super_BaseGenerator).parser_;
  if (((pPVar4->opts).include_dependence_headers == true) && ((pPVar4->opts).python_typing == false)
     ) {
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_160,(anonymous_namespace)::Indent_abi_cxx11_);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first.field_2._8_8_ = plVar5[3];
      local_140.first._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_140.first._M_dataplus._M_p,
                      local_140.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_a0,"from ",&local_e0.first);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_100.field_2._M_allocated_capacity = *psVar7;
      local_100.field_2._8_8_ = plVar5[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar7;
      local_100._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_100._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_e0.second._M_dataplus._M_p);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first.field_2._8_8_ = plVar5[3];
      local_140.first._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_140.first.field_2._M_allocated_capacity = *psVar7;
      local_140.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_140.first._M_dataplus._M_p,
                      local_140.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_a0.field_2._M_allocated_capacity = *psVar7;
    local_a0.field_2._8_8_ = plVar5[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar7;
    local_a0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_a0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
  paVar1 = &local_100.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_100.field_2._M_allocated_capacity = *puVar8;
    local_100.field_2._8_8_ = plVar5[3];
    local_100._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_100.field_2._M_allocated_capacity = *puVar8;
    local_100._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_100._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  GenTypeGet_abi_cxx11_(&local_78,this,local_58);
  paVar2 = &local_160.field_2;
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    uVar9 = local_100.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_78._M_string_length + local_100._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar9 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_100._M_string_length <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_78,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      goto LAB_00280f9d;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_78._M_dataplus._M_p);
LAB_00280f9d:
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160.field_2._8_8_ = puVar6[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_160._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first.field_2._8_8_ = plVar5[3];
    local_140.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_100,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160.field_2._8_8_ = plVar5[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first.field_2._8_8_ = plVar5[3];
    local_140.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_100,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160.field_2._8_8_ = plVar5[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first.field_2._8_8_ = plVar5[3];
    local_140.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first.field_2._8_8_ = plVar5[3];
    local_140.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_140.first.field_2._M_allocated_capacity = *psVar7;
    local_140.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_140.first._M_dataplus._M_p,
                    local_140.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
    operator_delete(local_e0.second._M_dataplus._M_p,
                    local_e0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void GetStructFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr, ImportMap &imports) const {
    auto &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field) + "(self)";

    const ImportMapEntry import_entry = {
      GenPackageReference(field.value.type), TypeName(field)
    };

    if (parser_.opts.python_typing) {
      const std::string return_type = ReturnType(struct_def, field);
      code += " -> Optional[" + return_type + "]";
      imports.insert(ImportMapEntry{ "typing", "Optional" });
      imports.insert(import_entry);
    }
    code += ":";
    code += OffsetPrefix(field);
    if (field.value.type.struct_def->fixed) {
      code += Indent + Indent + Indent + "x = o + self._tab.Pos\n";
    } else {
      code += Indent + Indent + Indent;
      code += "x = self._tab.Indirect(o + self._tab.Pos)\n";
    }

    if (parser_.opts.include_dependence_headers &&
        !parser_.opts.python_typing) {
      code += Indent + Indent + Indent;
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }
    code += Indent + Indent + Indent + "obj = " + TypeName(field) + "()\n";
    code += Indent + Indent + Indent + "obj.Init(self._tab.Bytes, x)\n";
    code += Indent + Indent + Indent + "return obj\n";
    code += Indent + Indent + "return None\n\n";
  }